

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O2

size_t release_unused_segments(mstate m)

{
  tbinptr pmVar1;
  char *ptr;
  malloc_segment *pmVar2;
  malloc_tree_chunk *pmVar3;
  bindex_t bVar4;
  uint uVar5;
  long lVar6;
  tbinptr pmVar7;
  malloc_tree_chunk **ppmVar8;
  int iVar9;
  malloc_tree_chunk *pmVar10;
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  tbinptr pmVar14;
  long lVar15;
  byte bVar16;
  malloc_tree_chunk **ppmVar17;
  ulong uVar18;
  uint uVar19;
  malloc_segment *pmVar20;
  ulong uVar21;
  malloc_segment *local_58;
  
  uVar18 = 0;
  sVar13 = 0;
  pmVar2 = (m->seg).next;
  pmVar20 = &m->seg;
LAB_0012ef8a:
  do {
    do {
      local_58 = pmVar20;
      pmVar20 = pmVar2;
      if (pmVar20 == (malloc_segment *)0x0) {
        sVar11 = 0xff;
        if (0xff < uVar18) {
          sVar11 = uVar18;
        }
        m->release_checks = sVar11;
        return sVar13;
      }
      ptr = pmVar20->base;
      sVar11 = pmVar20->size;
      pmVar2 = pmVar20->next;
      uVar18 = uVar18 + 1;
      uVar12 = (ulong)(-(int)ptr - 0x10U & 7);
      pmVar1 = (tbinptr)(ptr + uVar12);
      uVar12 = *(ulong *)(ptr + uVar12 + 8);
      uVar21 = uVar12 & 0xfffffffffffffffc;
    } while (((uVar12 & 2) != 0) ||
            ((char *)((long)pmVar1->child + (uVar21 - 0x20)) < ptr + (sVar11 - 0x40)));
    if (pmVar1 == (tbinptr)m->dv) {
      m->dv = (mchunkptr)0x0;
      m->dvsize = 0;
    }
    else {
      pmVar14 = pmVar1->bk;
      pmVar3 = pmVar1->child[2];
      if (pmVar14 == pmVar1) {
        if (pmVar1->child[1] == (tbinptr)0x0) {
          if (pmVar1->child[0] == (tbinptr)0x0) {
            pmVar14 = (tbinptr)0x0;
            goto LAB_0012f05f;
          }
          pmVar7 = pmVar1->child[0];
          ppmVar8 = pmVar1->child;
        }
        else {
          pmVar7 = pmVar1->child[1];
          ppmVar8 = pmVar1->child + 1;
        }
        do {
          do {
            ppmVar17 = ppmVar8;
            pmVar14 = pmVar7;
            pmVar7 = pmVar14->child[1];
            ppmVar8 = pmVar14->child + 1;
          } while (pmVar14->child[1] != (malloc_tree_chunk *)0x0);
          pmVar7 = pmVar14->child[0];
          ppmVar8 = pmVar14->child;
        } while (pmVar14->child[0] != (malloc_tree_chunk *)0x0);
        *ppmVar17 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar10 = pmVar1->fd;
        pmVar10->bk = pmVar14;
        pmVar14->fd = pmVar10;
      }
LAB_0012f05f:
      if (pmVar3 != (malloc_tree_chunk *)0x0) {
        bVar4 = (bindex_t)pmVar1->child[3];
        if (pmVar1 == m->treebins[bVar4]) {
          m->treebins[bVar4] = pmVar14;
          if (pmVar14 != (tbinptr)0x0) goto LAB_0012f094;
          bVar16 = (byte)bVar4 & 0x1f;
          m->treemap = m->treemap & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
        }
        else {
          pmVar3->child[pmVar3->child[0] != pmVar1] = pmVar14;
          if (pmVar14 != (tbinptr)0x0) {
LAB_0012f094:
            pmVar14->child[2] = pmVar3;
            pmVar3 = pmVar1->child[0];
            if (pmVar3 != (malloc_tree_chunk *)0x0) {
              pmVar14->child[0] = pmVar3;
              pmVar3->parent = pmVar14;
            }
            pmVar3 = pmVar1->child[1];
            if (pmVar3 != (malloc_tree_chunk *)0x0) {
              pmVar14->child[1] = pmVar3;
              pmVar3->parent = pmVar14;
            }
          }
        }
      }
    }
    iVar9 = CALL_MUNMAP(ptr,sVar11);
    if (iVar9 == 0) {
      sVar13 = sVar13 + sVar11;
      local_58->next = pmVar2;
      pmVar20 = local_58;
    }
    else {
      uVar19 = (uint)(uVar12 >> 8);
      if (uVar19 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0x1f;
        if (uVar19 < 0x10000) {
          uVar5 = 0x1f;
          if (uVar19 != 0) {
            for (; uVar19 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar12 = (ulong)((uVar21 >> ((ulong)(byte)(0x26 - (char)(uVar5 ^ 0x1f)) & 0x3f) & 1) != 0)
                   | (ulong)((uVar5 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      pmVar3 = (malloc_tree_chunk *)(m->treebins + uVar12);
      pmVar1->child[3] = (malloc_tree_chunk *)uVar12;
      pmVar1->child[0] = (malloc_tree_chunk *)0x0;
      pmVar1->child[1] = (malloc_tree_chunk *)0x0;
      if ((m->treemap >> ((uint)uVar12 & 0x1f) & 1) == 0) {
        m->treemap = m->treemap | 1 << ((byte)uVar12 & 0x1f);
        pmVar3->prev_foot = (size_t)pmVar1;
        pmVar1->child[2] = pmVar3;
      }
      else {
        bVar16 = 0x39 - (char)(uVar12 >> 1);
        if (uVar12 == 0x1f) {
          bVar16 = 0;
        }
        lVar15 = uVar21 << (bVar16 & 0x3f);
        pmVar3 = (malloc_tree_chunk *)pmVar3->prev_foot;
        do {
          pmVar10 = pmVar3;
          if ((pmVar10->head & 0xfffffffffffffffc) == uVar21) {
            pmVar3 = pmVar10->fd;
            pmVar3->bk = pmVar1;
            pmVar10->fd = pmVar1;
            pmVar1->fd = pmVar3;
            pmVar1->bk = pmVar10;
            pmVar1->child[2] = (malloc_tree_chunk *)0x0;
            goto LAB_0012ef8a;
          }
          lVar6 = lVar15 >> 0x3f;
          lVar15 = lVar15 * 2;
          pmVar3 = *(malloc_tree_chunk **)((long)pmVar10 + lVar6 * -8 + 0x20);
        } while (pmVar3 != (malloc_tree_chunk *)0x0);
        *(tbinptr *)((long)pmVar10 + lVar6 * -8 + 0x20) = pmVar1;
        pmVar1->child[2] = pmVar10;
      }
      pmVar1->bk = pmVar1;
      pmVar1->fd = pmVar1;
    }
  } while( true );
}

Assistant:

static size_t release_unused_segments(mstate m)
{
  size_t released = 0;
  size_t nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char *base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    nsegs++;
    {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!cinuse(p) && (char *)p + psize >= base + size - TOP_FOOT_SIZE) {
	tchunkptr tp = (tchunkptr)p;
	if (p == m->dv) {
	  m->dv = 0;
	  m->dvsize = 0;
	} else {
	  unlink_large_chunk(m, tp);
	}
	if (CALL_MUNMAP(base, size) == 0) {
	  released += size;
	  /* unlink obsoleted record */
	  sp = pred;
	  sp->next = next;
	} else { /* back out if cannot unmap */
	  insert_large_chunk(m, tp, psize);
	}
      }
    }
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = nsegs > MAX_RELEASE_CHECK_RATE ?
		      nsegs : MAX_RELEASE_CHECK_RATE;
  return released;
}